

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::TruncCase::TruncCase
          (TruncCase *this,Context *context,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  allocator<char> local_a1;
  VarType local_a0;
  string local_88;
  Symbol local_68;
  
  getCommonFuncCaseName_abi_cxx11_
            (&local_68.name,(Functional *)(ulong)baseType,precision,shaderType,shaderType);
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,context,local_68.name._M_dataplus._M_p,"trunc",
             shaderType);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_01e54230;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"in0",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.inputs,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"out0",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.outputs,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::assign((char *)&(this->super_CommonFunctionCase).m_spec.source);
  return;
}

Assistant:

TruncCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: CommonFunctionCase(context, getCommonFuncCaseName(baseType, precision, shaderType).c_str(), "trunc", shaderType)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(baseType, precision)));
		m_spec.source = "out0 = trunc(in0);";
	}